

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O2

ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> * __thiscall
coro_io::io_context_pool::get_executor(io_context_pool *this)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  
  LOCK();
  paVar1 = &this->next_io_context_;
  uVar2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return (ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)
         ((_Tuple_impl<0UL,_coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_*,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>
           )(this->executors).
            super__Vector_base<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start
            [uVar2 % (ulong)((long)(this->io_contexts_).
                                   super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->io_contexts_).
                                   super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4)]._M_t.
            super___uniq_ptr_impl<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>
            ._M_t).
         super__Tuple_impl<0UL,_coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_*,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>
  ;
}

Assistant:

coro_io::ExecutorWrapper<> *get_executor() {
    auto i = next_io_context_.fetch_add(1, std::memory_order::relaxed);
    auto *ret = executors[i % io_contexts_.size()].get();
    return ret;
  }